

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

void __thiscall
iutest::detail::ExpressionLHS<bool>::ExpressionLHS(ExpressionLHS<bool> *this,bool *lhs)

{
  bool *lhs_local;
  ExpressionLHS<bool> *this_local;
  
  this->m_lhs = (bool)(*lhs & 1);
  std::__cxx11::string::string((string *)&this->m_message);
  AppendMessage<bool>(this,&this->m_lhs);
  return;
}

Assistant:

explicit ExpressionLHS(T&& lhs) : m_lhs( ::std::forward<T>(lhs) )
    {
        AppendMessage(m_lhs);
    }